

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_bool32 ma_dr_mp3_seek_forward_by_pcm_frames__brute_force(ma_dr_mp3 *pMP3,ma_uint64 frameOffset)

{
  ma_uint64 mVar1;
  
  mVar1 = ma_dr_mp3_read_pcm_frames_s16(pMP3,frameOffset,(ma_int16 *)0x0);
  return (ma_bool32)(mVar1 == frameOffset);
}

Assistant:

static ma_bool32 ma_dr_mp3_seek_forward_by_pcm_frames__brute_force(ma_dr_mp3* pMP3, ma_uint64 frameOffset)
{
    ma_uint64 framesRead;
#if defined(MA_DR_MP3_FLOAT_OUTPUT)
    framesRead = ma_dr_mp3_read_pcm_frames_f32(pMP3, frameOffset, NULL);
#else
    framesRead = ma_dr_mp3_read_pcm_frames_s16(pMP3, frameOffset, NULL);
#endif
    if (framesRead != frameOffset) {
        return MA_FALSE;
    }
    return MA_TRUE;
}